

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall Js::JavascriptLibrary::ResetIntlObject(JavascriptLibrary *this)

{
  Recycler *recycler;
  ScriptContext *scriptContext;
  ObjectPrototypeObject *prototype;
  ScriptContext **ppSVar1;
  ObjectPrototypeObject **ppOVar2;
  DeferredTypeHandler<&Js::JavascriptLibrary::InitializeIntlObject,_Js::DefaultDeferredTypeFilter,_false,_(unsigned_short)0,_(unsigned_short)0>
  *typeHandler;
  DynamicType *type;
  DynamicObject *ptr;
  JavascriptLibrary *this_local;
  
  recycler = this->recycler;
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  scriptContext = *ppSVar1;
  ppOVar2 = Memory::WriteBarrierPtr::operator_cast_to_ObjectPrototypeObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).objectPrototype);
  prototype = *ppOVar2;
  typeHandler = DeferredTypeHandler<&Js::JavascriptLibrary::InitializeIntlObject,_Js::DefaultDeferredTypeFilter,_false,_(unsigned_short)0,_(unsigned_short)0>
                ::GetDefaultInstance();
  type = DynamicType::New(scriptContext,TypeIds_Object,(RecyclableObject *)prototype,
                          (JavascriptMethod)0x0,(DynamicTypeHandler *)typeHandler,false,false);
  ptr = DynamicObject::New(recycler,type);
  Memory::WriteBarrierPtr<Js::DynamicObject>::operator=
            (&(this->super_JavascriptLibraryBase).IntlObject,ptr);
  return;
}

Assistant:

void JavascriptLibrary::ResetIntlObject()
    {
        IntlObject = DynamicObject::New(
            recycler,
            DynamicType::New(scriptContext,
                             TypeIds_Object, objectPrototype, nullptr,
                             DeferredTypeHandler<InitializeIntlObject>::GetDefaultInstance()));
    }